

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

bool __thiscall
tsbp::LeftmostActiveOnly::IsFixedSequence(LeftmostActiveOnly *this,Node *node,size_t nextItemId)

{
  initializer_list<unsigned_long> __l;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer pPVar1;
  const_reference pvVar2;
  reference pvVar3;
  size_t nextItemIdToPlace;
  size_t itemIdToPlace;
  Rectangle *placedItem;
  size_t i;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *placedItems;
  allocator<unsigned_long> local_f1;
  unsigned_long local_f0 [17];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> fixedSequence;
  size_t numberOfPlacedItems;
  size_t currentItemId;
  unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *packing;
  size_t nextItemId_local;
  Node *node_local;
  LeftmostActiveOnly *this_local;
  
  this_00 = Node::PlacedItems(node);
  fixedSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_00)
  ;
  memcpy(local_f0,&DAT_00191ed8,0x88);
  local_60 = 0x11;
  local_68 = local_f0;
  std::allocator<unsigned_long>::allocator(&local_f1);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,__l,&local_f1);
  std::allocator<unsigned_long>::~allocator(&local_f1);
  pPVar1 = std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator->
                     (&node->Packing);
  placedItem = (Rectangle *)0x0;
  do {
    if (fixedSequence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= placedItem) {
      if (nextItemId == 0xffffffffffffffff) {
        this_local._7_1_ = true;
      }
      else {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                            (size_type)
                            fixedSequence.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (*pvVar3 == nextItemId) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
LAB_0013f8e2:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
      return this_local._7_1_;
    }
    pvVar2 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                       (&pPVar1->Items,(size_type)placedItem);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                        (size_type)placedItem);
    if ((long)pvVar2->InternId != *pvVar3) {
      this_local._7_1_ = false;
      goto LAB_0013f8e2;
    }
    placedItem = (Rectangle *)((long)&placedItem->X + 1);
  } while( true );
}

Assistant:

bool LeftmostActiveOnly::IsFixedSequence(const Node& node, size_t nextItemId)
{
    const auto& packing = node.Packing;
    size_t currentItemId = node.ItemIdToPlace;

    size_t numberOfPlacedItems = node.PlacedItems().count();

    std::vector<size_t> fixedSequence = {0, 10, 5, 9, 14, 11, 2, 4, 7, 3, 6, 16, 12, 1, 15, 17, 13};

    const auto& placedItems = node.Packing->Items;
    for (size_t i = 0; i < numberOfPlacedItems; i++)
    {
        const Rectangle& placedItem = placedItems[i];

        size_t itemIdToPlace = fixedSequence[i];

        if (placedItem.InternId != itemIdToPlace)
        {
            return false;
        }
    }

    if (nextItemId == -1)
    {
        return true;
    }

    size_t nextItemIdToPlace = fixedSequence[numberOfPlacedItems];
    if (nextItemIdToPlace != nextItemId)
    {
        return false;
    }

    return true;
}